

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

char * String::findLastOf(char *in,char *chars)

{
  char *local_28;
  char *match;
  char *result;
  char *chars_local;
  char *in_local;
  
  match = (char *)0x0;
  for (local_28 = strpbrk(in,chars); local_28 != (char *)0x0; local_28 = strpbrk(local_28 + 1,chars)
      ) {
    match = local_28;
  }
  return match;
}

Assistant:

const char* String::findLastOf(const char* in, const char* chars)
{
  const char* result = 0;
  const char* match = strpbrk(in, chars);
  for(;;)
  {
    if(!match)
      return result;
    result = match;
    match = strpbrk(match + 1, chars);
  }
}